

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManSetCutRefs(Lf_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  if ((p->vMemSets).nSize * 0x1000 - (p->vFreeSets).nSize != 0) {
    printf("The number of used cutsets = %d.\n");
  }
  pGVar3 = p->pGia;
  uVar2 = pGVar3->nObjs;
  if ((0 < (int)uVar2) && (pGVar4 = pGVar3->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      uVar12 = *(ulong *)(&pGVar4->field_0x0 + lVar10);
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar12) {
        if (*(int *)((long)&pGVar4->Value + lVar10) != 0) {
          __assert_fail("pObj->Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                        ,0x5af,"void Lf_ManSetCutRefs(Lf_Man_t *)");
        }
        uVar8 = (uint)uVar12 & 0x1fffffff;
        uVar11 = (uint)(uVar12 >> 0x20);
        if (uVar8 == 0x1fffffff || uVar8 != (uVar11 & 0x1fffffff)) {
          iVar7 = (int)(uVar12 & 0x1fffffff);
          uVar5 = *(undefined8 *)((long)pGVar4 + lVar10 + (ulong)(uint)(iVar7 * 4) * -3);
          uVar8 = (uint)uVar5;
          if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
             ((((uint)((ulong)uVar5 >> 0x20) ^ uVar8) & 0x1fffffff) != 0)) {
            piVar1 = (int *)((long)pGVar4 + lVar10 + (ulong)(uint)(iVar7 << 2) * -3 + 8);
            *piVar1 = *piVar1 + 1;
          }
          uVar11 = uVar11 & 0x1fffffff;
          uVar5 = *(undefined8 *)((long)pGVar4 + lVar10 + (ulong)(uVar11 * 4) * -3);
          uVar8 = (uint)uVar5;
          if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
             ((((uint)((ulong)uVar5 >> 0x20) ^ uVar8) & 0x1fffffff) != 0)) {
            piVar1 = (int *)((long)pGVar4 + lVar10 + (ulong)(uVar11 << 2) * -3 + 8);
            *piVar1 = *piVar1 + 1;
          }
          puVar6 = pGVar3->pMuxes;
          if ((puVar6 != (uint *)0x0) && (*(int *)((long)puVar6 + lVar9) != 0)) {
            if ((int)*(uint *)((long)puVar6 + lVar9) < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar8 = *(uint *)((long)puVar6 + lVar9) >> 1;
            if (uVar2 <= uVar8) goto LAB_00769f85;
            uVar11 = (uint)*(undefined8 *)(pGVar4 + uVar8);
            if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
               ((((uint)((ulong)*(undefined8 *)(pGVar4 + uVar8) >> 0x20) ^ uVar11) & 0x1fffffff) !=
                0)) {
              pGVar4[uVar8].Value = pGVar4[uVar8].Value + 1;
            }
          }
          if (pGVar3->pSibls != (int *)0x0) {
            uVar8 = *(uint *)((long)pGVar3->pSibls + lVar9);
            uVar12 = (ulong)uVar8;
            if (uVar12 != 0) {
              if (((int)uVar8 < 0) || (uVar2 <= uVar8)) {
LAB_00769f85:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              uVar8 = (uint)*(undefined8 *)(pGVar4 + uVar12);
              if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
                 ((((uint)((ulong)*(undefined8 *)(pGVar4 + uVar12) >> 0x20) ^ uVar8) & 0x1fffffff)
                  != 0)) {
                pGVar4[uVar12].Value = pGVar4[uVar12].Value + 1;
              }
            }
          }
        }
      }
      lVar10 = lVar10 + 0xc;
      lVar9 = lVar9 + 4;
    } while ((ulong)uVar2 * 0xc != lVar10);
  }
  return;
}

Assistant:

void Lf_ManSetCutRefs( Lf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    if ( Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) != Vec_IntSize(&p->vFreeSets) )
        printf( "The number of used cutsets = %d.\n", Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) - Vec_IntSize(&p->vFreeSets) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        assert( pObj->Value == 0 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
        if ( Gia_ObjIsMuxId(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p->pGia, pObj)) )
            Gia_ObjFanin2(p->pGia, pObj)->Value++;
        if ( Gia_ObjSibl(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjSiblObj(p->pGia, i)) )
            Gia_ObjSiblObj(p->pGia, i)->Value++;
    }
}